

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void f3b(int (*a) [22])

{
  __int_type _Var1;
  ostream *poVar2;
  ostream *this;
  int *in_RDI;
  rep_conflict rVar3;
  scoped_lock l_1;
  scoped_lock l;
  spin_mutex_t *in_stack_ffffffffffffff08;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff10;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff18;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff20;
  bool local_71;
  duration<double,_std::ratio<1L,_1L>_> local_60 [2];
  undefined8 local_50;
  rep local_48;
  duration<double,_std::ratio<1L,_1L>_> local_40 [4];
  int *local_20;
  __atomic_base<int> local_18;
  uint local_14;
  undefined4 local_10;
  uint local_c;
  atomic<int> *local_8;
  
  local_20 = in_RDI;
  _Var1 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_ffffffffffffff18);
  local_71 = false;
  if (-1 < _Var1) {
    _Var1 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_ffffffffffffff18);
    local_71 = _Var1 < 8;
  }
  local_14 = (uint)local_71;
  local_8 = &success_counter;
  local_10 = 5;
  LOCK();
  UNLOCK();
  local_18 = success_counter.super___atomic_base<int>._M_i;
  inwritemode = true;
  local_c = local_14;
  success_counter.super___atomic_base<int>._M_i =
       (__atomic_base<int>)
       (__atomic_base<int>)(success_counter.super___atomic_base<int>._M_i + local_14)._M_i;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  poVar2 = std::operator<<((ostream *)&std::cerr,"f3b ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_20);
  poVar2 = std::operator<<(poVar2," begin: ");
  local_50 = std::chrono::_V2::system_clock::now();
  local_48 = (rep)std::chrono::operator-(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->__d);
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_40);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x1223a2);
  *local_20 = *local_20 + 1;
  fun(SUB81((ulong)rVar3 >> 0x38,0),SUB84(rVar3,0));
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  poVar2 = std::operator<<((ostream *)&std::cerr,"f3b ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_20);
  poVar2 = std::operator<<(poVar2," end: ");
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->__d);
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_60);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar3);
  this = std::operator<<(poVar2,"\n-------------");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  _Var1 = (__int_type)((ulong)this >> 0x20);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x1224ce);
  inwritemode = false;
  std::__atomic_base<int>::operator=((__atomic_base<int> *)poVar2,_Var1);
  second_round = true;
  return;
}

Assistant:

void f3b(int (&a)[22])
{ 
  success_counter.fetch_add((x >= 0) && (x < 8)); //f3 must have finished
  inwritemode = true;
  LOG("f3b " << a[0] << " begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  a[0]++;
  fun(false);
  LOG("f3b " << a[0] << " end: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << "\n-------------");
  inwritemode = false;
  x = -256;
  second_round = true;
}